

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

void __thiscall Component_contains_Test::~Component_contains_Test(Component_contains_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, contains)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c21 = libcellml::Component::create();
    c1->setName("child1");
    c2->setName("child2");
    c2->addComponent(c21);

    EXPECT_FALSE(c->containsComponent("child1"));

    c->addComponent(c1);
    c->addComponent(c2);
    EXPECT_TRUE(c->containsComponent(c2));
    EXPECT_TRUE(c->containsComponent(c21));
}